

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O0

Persistence_landscape * __thiscall
Gudhi::Persistence_representations::Persistence_landscape::
multiply_lanscape_by_real_number_not_overwrite
          (Persistence_landscape *__return_storage_ptr__,Persistence_landscape *this,double x)

{
  pointer ppVar1;
  pointer pvVar2;
  size_type sVar3;
  pointer ppVar4;
  const_reference pvVar5;
  size_type sVar6;
  const_reference __x;
  const_reference pvVar7;
  reference this_00;
  reference this_01;
  pair<double,_double> pVar8;
  double local_98;
  pair<double,_double> local_90;
  size_type local_80;
  size_t i;
  undefined1 local_70 [8];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> lambda_dim;
  size_t dim;
  allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  local_39;
  undefined1 local_38 [8];
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  result;
  double x_local;
  Persistence_landscape *this_local;
  Persistence_landscape *res;
  
  result.
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)x;
  sVar3 = std::
          vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
          ::size(&this->land);
  std::
  allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>::
  allocator(&local_39);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::vector((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
            *)local_38,sVar3,&local_39);
  std::
  allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>::
  ~allocator(&local_39);
  lambda_dim.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    ppVar1 = lambda_dim.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppVar4 = (pointer)std::
                      vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      ::size(&this->land);
    if (ppVar1 == ppVar4) break;
    pvVar5 = std::
             vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ::operator[](&this->land,
                          (size_type)
                          lambda_dim.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar3 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            size(pvVar5);
    std::allocator<std::pair<double,_double>_>::allocator
              ((allocator<std::pair<double,_double>_> *)((long)&i + 7));
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_70,sVar3,(allocator<std::pair<double,_double>_> *)((long)&i + 7));
    std::allocator<std::pair<double,_double>_>::~allocator
              ((allocator<std::pair<double,_double>_> *)((long)&i + 7));
    local_80 = 0;
    while( true ) {
      sVar3 = local_80;
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&this->land,
                            (size_type)
                            lambda_dim.
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar6 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              size(pvVar5);
      if (sVar3 == sVar6) break;
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&this->land,
                            (size_type)
                            lambda_dim.
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __x = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            operator[](pvVar5,local_80);
      pvVar2 = result.
               super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&this->land,
                            (size_type)
                            lambda_dim.
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar7 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](pvVar5,local_80);
      local_98 = (double)pvVar2 * pvVar7->second;
      pVar8 = std::make_pair<double_const&,double>(&__x->first,&local_98);
      local_90 = pVar8;
      this_00 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              *)local_70,local_80);
      std::pair<double,_double>::operator=(this_00,&local_90);
      local_80 = local_80 + 1;
    }
    this_01 = std::
              vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
              ::operator[]((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                            *)local_38,
                           (size_type)
                           lambda_dim.
                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::operator=
              (this_01,(vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        *)local_70);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_70);
    lambda_dim.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&(lambda_dim.
                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->first + 1);
  }
  Persistence_landscape(__return_storage_ptr__);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::swap(&__return_storage_ptr__->land,
         (vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
          *)local_38);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Persistence_landscape Persistence_landscape::multiply_lanscape_by_real_number_not_overwrite(double x) const {
  std::vector<std::vector<std::pair<double, double> > > result(this->land.size());
  for (size_t dim = 0; dim != this->land.size(); ++dim) {
    std::vector<std::pair<double, double> > lambda_dim(this->land[dim].size());
    for (size_t i = 0; i != this->land[dim].size(); ++i) {
      lambda_dim[i] = std::make_pair(this->land[dim][i].first, x * this->land[dim][i].second);
    }
    result[dim] = lambda_dim;
  }
  Persistence_landscape res;
  // CHANGE
  // res.land = result;
  res.land.swap(result);
  return res;
}